

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlStringLenDecodeEntities
                    (xmlParserCtxtPtr ctxt,xmlChar *str,int len,int what,xmlChar end,xmlChar end2,
                    xmlChar end3)

{
  xmlChar end2_local;
  xmlChar end_local;
  int what_local;
  int len_local;
  xmlChar *str_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (((ctxt == (xmlParserCtxtPtr)0x0) || (str == (xmlChar *)0x0)) || (len < 0)) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else if (((str[len] == '\0') && (end == '\0')) && ((end2 == '\0' && (end3 == '\0')))) {
    ctxt_local = (xmlParserCtxtPtr)xmlExpandEntitiesInAttValue(ctxt,str,0);
  }
  else {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

xmlChar *
xmlStringLenDecodeEntities(xmlParserCtxtPtr ctxt, const xmlChar *str, int len,
                           int what ATTRIBUTE_UNUSED,
                           xmlChar end, xmlChar end2, xmlChar end3) {
    if ((ctxt == NULL) || (str == NULL) || (len < 0))
        return(NULL);

    if ((str[len] != 0) ||
        (end != 0) || (end2 != 0) || (end3 != 0))
        return(NULL);

    return(xmlExpandEntitiesInAttValue(ctxt, str, 0));
}